

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O0

int ffgcv(fitsfile *fptr,int datatype,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem
         ,void *nulval,void *array,int *anynul,int *status)

{
  LONGLONG unaff_RBX;
  LONGLONG unaff_RBP;
  int in_ESI;
  LONGLONG unaff_R14;
  int unaff_retaddr;
  fitsfile *in_stack_00000008;
  int *in_stack_00000020;
  char cdummy [2];
  int in_stack_000002fc;
  LONGLONG in_stack_00000300;
  LONGLONG in_stack_00000308;
  LONGLONG in_stack_00000310;
  int in_stack_0000031c;
  fitsfile *in_stack_00000320;
  char *in_stack_00000350;
  char **in_stack_00000358;
  char *in_stack_00000360;
  int *in_stack_00000368;
  int *in_stack_00000370;
  int in_stack_000071e4;
  LONGLONG in_stack_000071e8;
  LONGLONG in_stack_000071f0;
  LONGLONG in_stack_000071f8;
  int in_stack_00007204;
  fitsfile *in_stack_00007208;
  long in_stack_00007230;
  LONGLONG in_stack_00007238;
  LONGLONG in_stack_00007240;
  undefined4 in_stack_00007248;
  float in_stack_0000724c;
  undefined4 in_stack_00007250;
  int in_stack_00007254;
  fitsfile *in_stack_00007258;
  undefined4 in_stack_00007260;
  int in_stack_00007264;
  fitsfile *in_stack_00007268;
  undefined4 in_stack_00007270;
  int in_stack_00007274;
  fitsfile *in_stack_00007278;
  int in_stack_000072a0;
  char in_stack_000072a8;
  undefined1 in_stack_000072a9;
  undefined2 in_stack_000072aa;
  undefined4 in_stack_000072ac;
  int in_stack_000072b0;
  undefined4 in_stack_000072b4;
  uchar in_stack_000072b8;
  undefined1 in_stack_000072b9;
  undefined2 in_stack_000072ba;
  undefined4 in_stack_000072bc;
  int in_stack_000072c0;
  undefined4 in_stack_000072c4;
  double *in_stack_000072c8;
  int *in_stack_000072d0;
  int *in_stack_000072d8;
  int *in_stack_000072e0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  
  if (*in_stack_00000020 < 1) {
    if (in_ESI == 1) {
      ffgcx(in_stack_00000008,unaff_retaddr,unaff_RBP,unaff_R14,unaff_RBX,
            (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_00000020)
      ;
    }
    else if (in_ESI == 0xb) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgclb(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),
               CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
               in_stack_000072b8,(uchar *)CONCAT44(in_stack_000072c4,in_stack_000072c0),
               (char *)in_stack_000072c8,in_stack_000072d0,in_stack_000072d8);
      }
      else {
        ffgclb(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),
               CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
               in_stack_000072b8,(uchar *)CONCAT44(in_stack_000072c4,in_stack_000072c0),
               (char *)in_stack_000072c8,in_stack_000072d0,in_stack_000072d8);
      }
    }
    else if (in_ESI == 0xc) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgclsb(in_stack_00007258,in_stack_00007254,CONCAT44(in_stack_0000724c,in_stack_00007248),
                in_stack_00007240,in_stack_00007238,in_stack_00007230,in_stack_000072a0,
                in_stack_000072a8,(char *)CONCAT44(in_stack_000072b4,in_stack_000072b0),
                (char *)CONCAT44(in_stack_000072bc,
                                 CONCAT22(in_stack_000072ba,
                                          CONCAT11(in_stack_000072b9,in_stack_000072b8))),
                (int *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(int *)in_stack_000072c8);
      }
      else {
        ffgclsb(in_stack_00007258,in_stack_00007254,CONCAT44(in_stack_0000724c,in_stack_00007248),
                in_stack_00007240,in_stack_00007238,in_stack_00007230,in_stack_000072a0,
                in_stack_000072a8,(char *)CONCAT44(in_stack_000072b4,in_stack_000072b0),
                (char *)CONCAT44(in_stack_000072bc,
                                 CONCAT22(in_stack_000072ba,
                                          CONCAT11(in_stack_000072b9,in_stack_000072b8))),
                (int *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(int *)in_stack_000072c8);
      }
    }
    else if (in_ESI == 0x14) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgclui(in_stack_00007258,in_stack_00007254,CONCAT44(in_stack_0000724c,in_stack_00007248),
                in_stack_00007240,in_stack_00007238,in_stack_00007230,in_stack_000072a0,
                CONCAT11(in_stack_000072a9,in_stack_000072a8),
                (unsigned_short *)CONCAT44(in_stack_000072b4,in_stack_000072b0),
                (char *)CONCAT44(in_stack_000072bc,
                                 CONCAT22(in_stack_000072ba,
                                          CONCAT11(in_stack_000072b9,in_stack_000072b8))),
                (int *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(int *)in_stack_000072c8);
      }
      else {
        ffgclui(in_stack_00007258,in_stack_00007254,CONCAT44(in_stack_0000724c,in_stack_00007248),
                in_stack_00007240,in_stack_00007238,in_stack_00007230,in_stack_000072a0,
                CONCAT11(in_stack_000072a9,in_stack_000072a8),
                (unsigned_short *)CONCAT44(in_stack_000072b4,in_stack_000072b0),
                (char *)CONCAT44(in_stack_000072bc,
                                 CONCAT22(in_stack_000072ba,
                                          CONCAT11(in_stack_000072b9,in_stack_000072b8))),
                (int *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(int *)in_stack_000072c8);
      }
    }
    else if (in_ESI == 0x15) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgcli(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),
               CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
               CONCAT11(in_stack_000072b9,in_stack_000072b8),
               (short *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(char *)in_stack_000072c8,
               in_stack_000072d0,in_stack_000072d8);
      }
      else {
        ffgcli(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),
               CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
               CONCAT11(in_stack_000072b9,in_stack_000072b8),
               (short *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(char *)in_stack_000072c8,
               in_stack_000072d0,in_stack_000072d8);
      }
    }
    else if (in_ESI == 0x1e) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgcluk(in_stack_00007258,in_stack_00007254,CONCAT44(in_stack_0000724c,in_stack_00007248),
                in_stack_00007240,in_stack_00007238,in_stack_00007230,in_stack_000072a0,
                CONCAT22(in_stack_000072aa,CONCAT11(in_stack_000072a9,in_stack_000072a8)),
                (uint *)CONCAT44(in_stack_000072b4,in_stack_000072b0),
                (char *)CONCAT44(in_stack_000072bc,
                                 CONCAT22(in_stack_000072ba,
                                          CONCAT11(in_stack_000072b9,in_stack_000072b8))),
                (int *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(int *)in_stack_000072c8);
      }
      else {
        ffgcluk(in_stack_00007258,in_stack_00007254,CONCAT44(in_stack_0000724c,in_stack_00007248),
                in_stack_00007240,in_stack_00007238,in_stack_00007230,in_stack_000072a0,
                CONCAT22(in_stack_000072aa,CONCAT11(in_stack_000072a9,in_stack_000072a8)),
                (uint *)CONCAT44(in_stack_000072b4,in_stack_000072b0),
                (char *)CONCAT44(in_stack_000072bc,
                                 CONCAT22(in_stack_000072ba,
                                          CONCAT11(in_stack_000072b9,in_stack_000072b8))),
                (int *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(int *)in_stack_000072c8);
      }
    }
    else if (in_ESI == 0x1f) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgclk(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),
               CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
               CONCAT22(in_stack_000072ba,CONCAT11(in_stack_000072b9,in_stack_000072b8)),
               (int *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(char *)in_stack_000072c8,
               in_stack_000072d0,in_stack_000072d8);
      }
      else {
        ffgclk(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),
               CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
               CONCAT22(in_stack_000072ba,CONCAT11(in_stack_000072b9,in_stack_000072b8)),
               (int *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(char *)in_stack_000072c8,
               in_stack_000072d0,in_stack_000072d8);
      }
    }
    else if (in_ESI == 0x28) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgcluj(in_stack_00007258,in_stack_00007254,CONCAT44(in_stack_0000724c,in_stack_00007248),
                in_stack_00007240,in_stack_00007238,in_stack_00007230,in_stack_000072a0,
                CONCAT44(in_stack_000072ac,
                         CONCAT22(in_stack_000072aa,CONCAT11(in_stack_000072a9,in_stack_000072a8))),
                (unsigned_long *)CONCAT44(in_stack_000072b4,in_stack_000072b0),
                (char *)CONCAT44(in_stack_000072bc,
                                 CONCAT22(in_stack_000072ba,
                                          CONCAT11(in_stack_000072b9,in_stack_000072b8))),
                (int *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(int *)in_stack_000072c8);
      }
      else {
        ffgcluj(in_stack_00007258,in_stack_00007254,CONCAT44(in_stack_0000724c,in_stack_00007248),
                in_stack_00007240,in_stack_00007238,in_stack_00007230,in_stack_000072a0,
                CONCAT44(in_stack_000072ac,
                         CONCAT22(in_stack_000072aa,CONCAT11(in_stack_000072a9,in_stack_000072a8))),
                (unsigned_long *)CONCAT44(in_stack_000072b4,in_stack_000072b0),
                (char *)CONCAT44(in_stack_000072bc,
                                 CONCAT22(in_stack_000072ba,
                                          CONCAT11(in_stack_000072b9,in_stack_000072b8))),
                (int *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(int *)in_stack_000072c8);
      }
    }
    else if (in_ESI == 0x29) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgclj(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),
               CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
               CONCAT44(in_stack_000072bc,
                        CONCAT22(in_stack_000072ba,CONCAT11(in_stack_000072b9,in_stack_000072b8))),
               (long *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(char *)in_stack_000072c8,
               in_stack_000072d0,in_stack_000072d8);
      }
      else {
        ffgclj(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),
               CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
               CONCAT44(in_stack_000072bc,
                        CONCAT22(in_stack_000072ba,CONCAT11(in_stack_000072b9,in_stack_000072b8))),
               (long *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(char *)in_stack_000072c8,
               in_stack_000072d0,in_stack_000072d8);
      }
    }
    else if (in_ESI == 0x50) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgclujj(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
                 CONCAT44(in_stack_00007254,in_stack_00007250),
                 CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
                 CONCAT44(in_stack_000072bc,
                          CONCAT22(in_stack_000072ba,CONCAT11(in_stack_000072b9,in_stack_000072b8)))
                 ,(ULONGLONG *)CONCAT44(in_stack_000072c4,in_stack_000072c0),
                 (char *)in_stack_000072c8,in_stack_000072d0,in_stack_000072d8);
      }
      else {
        ffgclujj(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
                 CONCAT44(in_stack_00007254,in_stack_00007250),
                 CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
                 CONCAT44(in_stack_000072bc,
                          CONCAT22(in_stack_000072ba,CONCAT11(in_stack_000072b9,in_stack_000072b8)))
                 ,(ULONGLONG *)CONCAT44(in_stack_000072c4,in_stack_000072c0),
                 (char *)in_stack_000072c8,in_stack_000072d0,in_stack_000072d8);
      }
    }
    else if (in_ESI == 0x51) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgcljj(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
                CONCAT44(in_stack_00007254,in_stack_00007250),
                CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
                CONCAT44(in_stack_000072bc,
                         CONCAT22(in_stack_000072ba,CONCAT11(in_stack_000072b9,in_stack_000072b8))),
                (LONGLONG *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(char *)in_stack_000072c8,
                in_stack_000072d0,in_stack_000072d8);
      }
      else {
        ffgcljj(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
                CONCAT44(in_stack_00007254,in_stack_00007250),
                CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
                CONCAT44(in_stack_000072bc,
                         CONCAT22(in_stack_000072ba,CONCAT11(in_stack_000072b9,in_stack_000072b8))),
                (LONGLONG *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(char *)in_stack_000072c8,
                in_stack_000072d0,in_stack_000072d8);
      }
    }
    else if (in_ESI == 0x2a) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgcle(in_stack_00007278,in_stack_00007274,(LONGLONG)in_stack_00007268,
               CONCAT44(in_stack_00007264,in_stack_00007260),(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),in_stack_000072c0,in_stack_0000724c,
               (float *)in_stack_000072c8,(char *)in_stack_000072d0,in_stack_000072d8,
               in_stack_000072e0);
      }
      else {
        ffgcle(in_stack_00007278,in_stack_00007274,(LONGLONG)in_stack_00007268,
               CONCAT44(in_stack_00007264,in_stack_00007260),(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),in_stack_000072c0,in_stack_0000724c,
               (float *)in_stack_000072c8,(char *)in_stack_000072d0,in_stack_000072d8,
               in_stack_000072e0);
      }
    }
    else if (in_ESI == 0x52) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgcld(in_stack_00007278,in_stack_00007274,(LONGLONG)in_stack_00007268,
               CONCAT44(in_stack_00007264,in_stack_00007260),(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),in_stack_000072c0,
               (double)CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_000072c8,
               (char *)in_stack_000072d0,in_stack_000072d8,in_stack_000072e0);
      }
      else {
        ffgcld(in_stack_00007278,in_stack_00007274,(LONGLONG)in_stack_00007268,
               CONCAT44(in_stack_00007264,in_stack_00007260),(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),in_stack_000072c0,
               (double)CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_000072c8,
               (char *)in_stack_000072d0,in_stack_000072d8,in_stack_000072e0);
      }
    }
    else if (in_ESI == 0x53) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgcle(in_stack_00007278,in_stack_00007274,(LONGLONG)in_stack_00007268,
               CONCAT44(in_stack_00007264,in_stack_00007260),(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),in_stack_000072c0,in_stack_0000724c,
               (float *)in_stack_000072c8,(char *)in_stack_000072d0,in_stack_000072d8,
               in_stack_000072e0);
      }
      else {
        ffgcle(in_stack_00007278,in_stack_00007274,(LONGLONG)in_stack_00007268,
               CONCAT44(in_stack_00007264,in_stack_00007260),(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),in_stack_000072c0,in_stack_0000724c,
               (float *)in_stack_000072c8,(char *)in_stack_000072d0,in_stack_000072d8,
               in_stack_000072e0);
      }
    }
    else if (in_ESI == 0xa3) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgcld(in_stack_00007278,in_stack_00007274,(LONGLONG)in_stack_00007268,
               CONCAT44(in_stack_00007264,in_stack_00007260),(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),in_stack_000072c0,
               (double)CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_000072c8,
               (char *)in_stack_000072d0,in_stack_000072d8,in_stack_000072e0);
      }
      else {
        ffgcld(in_stack_00007278,in_stack_00007274,(LONGLONG)in_stack_00007268,
               CONCAT44(in_stack_00007264,in_stack_00007260),(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),in_stack_000072c0,
               (double)CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_000072c8,
               (char *)in_stack_000072d0,in_stack_000072d8,in_stack_000072e0);
      }
    }
    else if (in_ESI == 0xe) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgcll(in_stack_00007208,in_stack_00007204,in_stack_000071f8,in_stack_000071f0,
               in_stack_000071e8,in_stack_000071e4,(char)in_stack_00007250,(char *)in_stack_00007258
               ,(char *)CONCAT44(in_stack_00007264,in_stack_00007260),
               &in_stack_00007268->HDUposition,(int *)CONCAT44(in_stack_00007274,in_stack_00007270))
        ;
      }
      else {
        ffgcll(in_stack_00007208,in_stack_00007204,in_stack_000071f8,in_stack_000071f0,
               in_stack_000071e8,in_stack_000071e4,(char)in_stack_00007250,(char *)in_stack_00007258
               ,(char *)CONCAT44(in_stack_00007264,in_stack_00007260),
               &in_stack_00007268->HDUposition,(int *)CONCAT44(in_stack_00007274,in_stack_00007270))
        ;
      }
    }
    else if (in_ESI == 0x10) {
      if (in_stack_00000008 == (fitsfile *)0x0) {
        ffgcls(in_stack_00000320,in_stack_0000031c,in_stack_00000310,in_stack_00000308,
               in_stack_00000300,in_stack_000002fc,in_stack_00000350,in_stack_00000358,
               in_stack_00000360,in_stack_00000368,in_stack_00000370);
      }
      else {
        ffgcls(in_stack_00000320,in_stack_0000031c,in_stack_00000310,in_stack_00000308,
               in_stack_00000300,in_stack_000002fc,in_stack_00000350,in_stack_00000358,
               in_stack_00000360,in_stack_00000368,in_stack_00000370);
      }
    }
    else {
      *in_stack_00000020 = 0x19a;
    }
    iVar1 = *in_stack_00000020;
  }
  else {
    iVar1 = *in_stack_00000020;
  }
  return iVar1;
}

Assistant:

int ffgcv(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            int  colnum,      /* I - number of column to read (1 = 1st col) */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)        */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG nelem,       /* I - number of values to read                */
            void *nulval,     /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a table column. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of true if any pixels are undefined.
*/
{
    char cdummy[2];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TBIT)
    {
      ffgcx(fptr, colnum, firstrow, firstelem, nelem, (char *) array, status);
    }
    else if (datatype == TBYTE)
    {
      if (nulval == 0)
        ffgclb(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (unsigned char *) array, cdummy, anynul, status);
      else
       ffgclb(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(unsigned char *)
              nulval, (unsigned char *) array, cdummy, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
      if (nulval == 0)
        ffgclsb(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (signed char *) array, cdummy, anynul, status);
      else
       ffgclsb(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(signed char *)
              nulval, (signed char *) array, cdummy, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
      if (nulval == 0)
        ffgclui(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
               (unsigned short *) array, cdummy, anynul, status);
      else
        ffgclui(fptr, colnum, firstrow, firstelem, nelem, 1, 1,
               *(unsigned short *) nulval,
               (unsigned short *) array, cdummy, anynul, status);
    }
    else if (datatype == TSHORT)
    {
      if (nulval == 0)
        ffgcli(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (short *) array, cdummy, anynul, status);
      else
        ffgcli(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(short *)
              nulval, (short *) array, cdummy, anynul, status);
    }
    else if (datatype == TUINT)
    {
      if (nulval == 0)
        ffgcluk(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (unsigned int *) array, cdummy, anynul, status);
      else
        ffgcluk(fptr, colnum, firstrow, firstelem, nelem, 1, 1,
         *(unsigned int *) nulval, (unsigned int *) array, cdummy, anynul,
         status);
    }
    else if (datatype == TINT)
    {
      if (nulval == 0)
        ffgclk(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (int *) array, cdummy, anynul, status);
      else
        ffgclk(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(int *)
            nulval, (int *) array, cdummy, anynul, status);
    }
    else if (datatype == TULONG)
    {
      if (nulval == 0)
        ffgcluj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
               (unsigned long *) array, cdummy, anynul, status);
      else
        ffgcluj(fptr, colnum, firstrow, firstelem, nelem, 1, 1,
               *(unsigned long *) nulval, 
               (unsigned long *) array, cdummy, anynul, status);
    }
    else if (datatype == TLONG)
    {
      if (nulval == 0)
        ffgclj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (long *) array, cdummy, anynul, status);
      else
        ffgclj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(long *)
              nulval, (long *) array, cdummy, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
      if (nulval == 0)
        ffgclujj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (ULONGLONG *) array, cdummy, anynul, status);
      else
        ffgclujj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(ULONGLONG *)
              nulval, (ULONGLONG *) array, cdummy, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
      if (nulval == 0)
        ffgcljj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (LONGLONG *) array, cdummy, anynul, status);
      else
        ffgcljj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(LONGLONG *)
              nulval, (LONGLONG *) array, cdummy, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
      if (nulval == 0)
        ffgcle(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0.,
              (float *) array, cdummy, anynul, status);
      else
      ffgcle(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(float *)
               nulval,(float *) array, cdummy, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
      if (nulval == 0)
        ffgcld(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0.,
              (double *) array, cdummy, anynul, status);
      else
        ffgcld(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(double *)
              nulval, (double *) array, cdummy, anynul, status);
    }
    else if (datatype == TCOMPLEX)
    {
      if (nulval == 0)
        ffgcle(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
           1, 1, 0., (float *) array, cdummy, anynul, status);
      else
        ffgcle(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
           1, 1, *(float *) nulval, (float *) array, cdummy, anynul, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
      if (nulval == 0)
        ffgcld(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2, 
         1, 1, 0., (double *) array, cdummy, anynul, status);
      else
        ffgcld(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2, 
         1, 1, *(double *) nulval, (double *) array, cdummy, anynul, status);
    }

    else if (datatype == TLOGICAL)
    {
      if (nulval == 0)
        ffgcll(fptr, colnum, firstrow, firstelem, nelem, 1, 0,
          (char *) array, cdummy, anynul, status);
      else
        ffgcll(fptr, colnum, firstrow, firstelem, nelem, 1, *(char *) nulval,
          (char *) array, cdummy, anynul, status);
    }
    else if (datatype == TSTRING)
    {
      if (nulval == 0)
      {
        cdummy[0] = '\0';
        ffgcls(fptr, colnum, firstrow, firstelem, nelem, 1, 
             cdummy, (char **) array, cdummy, anynul, status);
      }
      else
        ffgcls(fptr, colnum, firstrow, firstelem, nelem, 1, (char *)
             nulval, (char **) array, cdummy, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}